

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QString,_QMimeTypeXMLData> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,QString *key)

{
  byte bVar1;
  size_t hash;
  Node<QString,_QMimeTypeXMLData> *pNVar2;
  Bucket BVar3;
  QStringView key_00;
  
  key_00.m_data = (key->d).ptr;
  key_00.m_size = (key->d).size;
  hash = ::qHash(key_00,this->seed);
  BVar3 = findBucketWithHash<QString>(this,key,hash);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if ((ulong)bVar1 == 0xff) {
    pNVar2 = (Node<QString,_QMimeTypeXMLData> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QMimeTypeXMLData> *)
             (((BVar3.span)->entries->storage).data + (ulong)bVar1 * 0x80 + (ulong)bVar1 * 8);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }